

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

void __thiscall Thread::Start(Thread *this)

{
  ThreadData *this_00;
  function<void_()> local_38;
  ThreadData *local_18;
  ThreadData *ptData;
  Thread *this_local;
  
  if ((this->m_bStarted & 1U) == 0) {
    ptData = (ThreadData *)this;
    this_00 = (ThreadData *)operator_new(0x20);
    std::function<void_()>::function(&local_38,&this->m_func);
    ThreadData::ThreadData(this_00,&local_38);
    std::function<void_()>::~function(&local_38);
    local_18 = this_00;
    pthread_create(&this->m_pthreadId,(pthread_attr_t *)0x0,ThreadRun,this_00);
    this->m_bStarted = true;
  }
  return;
}

Assistant:

void Thread::Start()
{
	if (!m_bStarted)
	{
		ThreadData * ptData = new ThreadData(m_func);
		pthread_create(&m_pthreadId, NULL, ThreadRun, static_cast<void *> (ptData));
		m_bStarted = true;
	}
}